

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void al_flush_event_queue(ALLEGRO_EVENT_QUEUE *queue)

{
  _func_void *p_Var1;
  undefined1 auVar2 [16];
  ALLEGRO_SYSTEM *pAVar3;
  ALLEGRO_USER_EVENT *event;
  ulong uVar4;
  
  pAVar3 = al_get_system_driver();
  p_Var1 = pAVar3->vt->heartbeat;
  if (p_Var1 != (_func_void *)0x0) {
    (*p_Var1)();
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  uVar4 = (ulong)queue->events_tail;
  if (queue->events_tail != queue->events_head) {
    do {
      event = (ALLEGRO_USER_EVENT *)_al_vector_ref(&queue->events,(uint)uVar4);
      if (0x1ff < event->type) {
        al_unref_user_event(event);
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (queue->events)._size;
      auVar2 = ZEXT416((uint)uVar4 + 1) % auVar2;
      uVar4 = auVar2._0_8_;
    } while (queue->events_head != auVar2._0_4_);
  }
  queue->events_head = 0;
  queue->events_tail = 0;
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
    return;
  }
  return;
}

Assistant:

void al_flush_event_queue(ALLEGRO_EVENT_QUEUE *queue)
{
   unsigned int i;
   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   /* Decrement reference counts on all user events. */
   i = queue->events_tail;
   while (i != queue->events_head) {
      ALLEGRO_EVENT *old_ev = _al_vector_ref(&queue->events, i);
      unref_if_user_event(old_ev);
      i = circ_array_next(&queue->events, i);
   }

   queue->events_head = queue->events_tail = 0;
   _al_mutex_unlock(&queue->mutex);
}